

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeSignedInteger
          (ParserImpl *this,int64 *value,uint64 max_value)

{
  bool bVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  uint64 unsigned_value;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-","");
  bVar1 = TryConsume(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar2 = ConsumeUnsignedInteger(this,(uint64 *)&local_50,bVar1 + max_value);
  if (bVar2) {
    _Var3._M_p = (pointer)-(long)local_50._M_dataplus._M_p;
    if (!bVar1) {
      _Var3._M_p = local_50._M_dataplus._M_p;
    }
    *value = (int64)_Var3._M_p;
  }
  return bVar2;
}

Assistant:

bool ConsumeSignedInteger(int64* value, uint64 max_value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
      // Two's complement always allows one more negative integer than
      // positive.
      ++max_value;
    }

    uint64 unsigned_value;

    DO(ConsumeUnsignedInteger(&unsigned_value, max_value));

    if (negative) {
      if ((static_cast<uint64>(kint64max) + 1) == unsigned_value) {
        *value = kint64min;
      } else {
        *value = -static_cast<int64>(unsigned_value);
      }
    } else {
      *value = static_cast<int64>(unsigned_value);
    }

    return true;
  }